

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  char *pcVar3;
  Logger *pLVar4;
  size_t sVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view title;
  string_view title_00;
  string_view title_01;
  string msg;
  string local_140;
  string local_120;
  string local_100;
  pthread_mutex_t *local_c8;
  string *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  string local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  Logger *local_78;
  char *local_70;
  string *local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  sVar5 = message._M_len;
  local_b8 = command;
  local_90.first = cmQtAutoGen::GeneratorName(genType);
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = (Logger *)0x11;
  pcVar3 = " subprocess error";
  local_70 = " subprocess error";
  local_68 = (string *)0x0;
  views._M_len = 2;
  views._M_array = &local_90;
  cmCatViews(&local_120,views);
  title._M_str = pcVar3;
  title._M_len = (size_t)local_120._M_dataplus._M_p;
  HeadLine_abi_cxx11_(&local_140,(Logger *)local_120._M_string_length,title);
  if (sVar5 == 0) {
    pcVar3 = "\n\n";
  }
  else {
    pcVar3 = "\n\n";
    if (message._M_str[sVar5 - 1] == '\n') {
      pcVar3 = "\n";
    }
  }
  local_100.field_2._M_allocated_capacity = (long)&local_100.field_2 + 8;
  local_100._M_dataplus._M_p = (pointer)0x0;
  local_100._M_string_length = 1;
  local_100.field_2._M_local_buf[8] = '\n';
  local_90.first._M_str = (char *)local_100.field_2._M_allocated_capacity;
  local_90.first._M_len = 1;
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78 = (Logger *)local_140._M_string_length;
  local_70 = local_140._M_dataplus._M_p;
  local_50 = 0;
  local_c8 = (pthread_mutex_t *)this;
  local_c0 = output;
  local_68 = &local_140;
  local_60 = sVar5;
  local_58 = message._M_str;
  local_48 = strlen(pcVar3);
  local_38 = 0;
  views_00._M_len = 4;
  views_00._M_array = &local_90;
  local_40 = pcVar3;
  cmCatViews(&local_b0,views_00);
  paVar1 = &local_140.field_2;
  pcVar3 = (char *)local_140._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    pcVar3 = (char *)local_140._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  title_00._M_str = pcVar3;
  title_00._M_len = (size_t)"Command";
  HeadLine_abi_cxx11_(&local_140,(Logger *)0x7,title_00);
  cmQtAutoGen::QuotedCommand(&local_120,local_b8);
  local_78 = (Logger *)local_120._M_string_length;
  local_70 = local_120._M_dataplus._M_p;
  local_60 = 2;
  pcVar3 = "\n\n";
  local_58 = "\n\n";
  local_50 = 0;
  views_01._M_len = 3;
  views_01._M_array = &local_90;
  local_90.second = &local_140;
  local_68 = &local_120;
  cmCatViews(&local_100,views_01);
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_100._M_dataplus._M_p);
  pLVar4 = (Logger *)local_120._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,(ulong)(local_100.field_2._M_allocated_capacity + 1))
    ;
    pLVar4 = (Logger *)local_120._M_string_length;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  title_01._M_str = (char *)pLVar4;
  title_01._M_len = (size_t)"Output";
  HeadLine_abi_cxx11_(&local_140,(Logger *)0x6,title_01);
  local_70 = (local_c0->_M_dataplus)._M_p;
  local_78 = (Logger *)local_c0->_M_string_length;
  if ((local_78 != (Logger *)0x0) && (pcVar3 = "\n\n", local_70[(long)local_78 - 1] == '\n')) {
    pcVar3 = "\n";
  }
  local_68 = (string *)0x0;
  local_90.second = &local_140;
  local_60 = strlen(pcVar3);
  local_50 = 0;
  views_02._M_len = 3;
  views_02._M_array = &local_90;
  local_58 = pcVar3;
  cmCatViews(&local_100,views_02);
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_100._M_dataplus._M_p);
  __mutex = local_c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,(ulong)(local_100.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  cmSystemTools::Stderr(&local_b0);
  pthread_mutex_unlock(__mutex);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}